

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Gia_Man_t * Gia_SweeperStart(Gia_Man_t *pGia)

{
  Gia_Man_t *local_10;
  Gia_Man_t *pGia_local;
  
  local_10 = pGia;
  if (pGia == (Gia_Man_t *)0x0) {
    local_10 = Gia_ManStart(10000);
  }
  if (local_10->pHTable == (int *)0x0) {
    Gia_ManHashStart(local_10);
  }
  Swp_ManStart(local_10);
  local_10->fSweeper = 1;
  return local_10;
}

Assistant:

Gia_Man_t * Gia_SweeperStart( Gia_Man_t * pGia )
{
    if ( pGia == NULL )
        pGia = Gia_ManStart( 10000 );
    if ( pGia->pHTable == NULL )
        Gia_ManHashStart( pGia );
    // recompute fPhase and fMark1 to mark multiple fanout nodes if AIG is already defined!!!

    Swp_ManStart( pGia );
    pGia->fSweeper = 1;
    return pGia;
}